

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O0

char * lws_wsi_client_stash_item(lws *wsi,int stash_idx,int hdr_idx)

{
  int hdr_idx_local;
  int stash_idx_local;
  lws *wsi_local;
  
  if (wsi->stash == (client_info_stash *)0x0) {
    wsi_local = (lws *)lws_hdr_simple_ptr(wsi,hdr_idx);
  }
  else {
    wsi_local = (lws *)wsi->stash->cis[stash_idx];
  }
  return (char *)wsi_local;
}

Assistant:

const char *
lws_wsi_client_stash_item(struct lws *wsi, int stash_idx, int hdr_idx)
{
	/* try the generic client stash */
	if (wsi->stash)
		return wsi->stash->cis[stash_idx];

#if defined(LWS_ROLE_H1) || defined(LWS_ROLE_H2)
	/* if not, use the ah stash if applicable */
	return lws_hdr_simple_ptr(wsi, hdr_idx);
#else
	return NULL;
#endif
}